

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::BasicNonMS<tcu::Vector<int,_4>,_4>::Run
          (BasicNonMS<tcu::Vector<int,_4>,_4> *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  GLint level;
  GLuint texture;
  GLuint unit;
  GLboolean layered;
  int i;
  ulong uVar2;
  GLenum *pGVar3;
  GLenum GVar4;
  ImageSizeMachine machine;
  ivec4 res [4];
  
  this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  pGVar3 = &DAT_01b4eb20;
  uVar2 = 0;
  do {
    GVar4 = *pGVar3;
    glu::CallLogWrapper::glBindTexture(this_00,GVar4,this->m_texture[uVar2]);
    glu::CallLogWrapper::glTexParameteri(this_00,GVar4,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,GVar4,0x2800,0x2600);
    switch(uVar2 & 0xffffffff) {
    case 0:
      glu::CallLogWrapper::glTexStorage2D(this_00,GVar4,10,0x8d82,0x200,0x80);
      texture = this->m_texture[uVar2];
      unit = 0;
      level = 1;
      layered = '\0';
      goto LAB_00c82f35;
    case 1:
      glu::CallLogWrapper::glTexStorage3D(this_00,GVar4,3,0x8d82,8,8,4);
      texture = this->m_texture[uVar2];
      unit = 1;
      level = 0;
      break;
    case 2:
      glu::CallLogWrapper::glTexStorage2D(this_00,GVar4,4,0x8d82,0x10,0x10);
      texture = this->m_texture[uVar2];
      unit = 2;
      level = 0;
      layered = '\x01';
      GVar4 = 0x88ba;
      goto LAB_00c82f42;
    case 3:
      glu::CallLogWrapper::glTexStorage3D(this_00,GVar4,3,0x8d82,0x7f,0x27,0xc);
      texture = this->m_texture[uVar2];
      unit = 3;
      level = 2;
      break;
    default:
      goto switchD_00c82e38_default;
    }
    layered = '\x01';
LAB_00c82f35:
    GVar4 = 35000;
LAB_00c82f42:
    glu::CallLogWrapper::glBindImageTexture(this_00,unit,texture,level,layered,0,GVar4,0x8d82);
switchD_00c82e38_default:
    uVar2 = uVar2 + 1;
    pGVar3 = pGVar3 + 1;
    if (uVar2 == 4) {
      ImageSizeMachine::ImageSizeMachine(&machine);
      res[0].m_data[0] = 0x100;
      res[0].m_data[1] = 0x40;
      res[0].m_data[2] = 0;
      res[0].m_data[3] = 0;
      res[1].m_data[0] = 8;
      res[1].m_data[1] = 8;
      res[1].m_data[2] = 4;
      res[1].m_data[3] = 0;
      res[2].m_data[0] = 0x10;
      res[2].m_data[1] = 0x10;
      res[2].m_data[2] = 0;
      res[2].m_data[3] = 0;
      res[3].m_data[0] = 0x1f;
      res[3].m_data[1] = 9;
      res[3].m_data[2] = 0xc;
      res[3].m_data[3] = 0;
      lVar1 = glcts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<int,4>>
                        ((ImageSizeMachine *)&machine,4,res);
      ImageSizeMachine::~ImageSizeMachine(&machine);
      return lVar1;
    }
  } while( true );
}

Assistant:

virtual long Run()
	{
		if (STAGE == 0 && !IsVSFSAvailable(4, 0))
			return NOT_SUPPORTED;
		if (STAGE == 5 && !IsVSFSAvailable(0, 4))
			return NOT_SUPPORTED;

		const GLenum target[4] = { GL_TEXTURE_2D, GL_TEXTURE_3D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_2D_ARRAY };
		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);

			if (i == 0)
			{
				glTexStorage2D(target[i], 10, TexInternalFormat<T>(), 512, 128);
				glBindImageTexture(0, m_texture[i], 1, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 8, 8, 4);
				glBindImageTexture(1, m_texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexStorage2D(target[i], 4, TexInternalFormat<T>(), 16, 16);
				glBindImageTexture(2, m_texture[i], 0, GL_TRUE, 0, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 127, 39, 12);
				glBindImageTexture(3, m_texture[i], 2, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[4] = { ivec4(256, 64, 0, 0), ivec4(8, 8, 4, 0), ivec4(16, 16, 0, 0), ivec4(31, 9, 12, 0) };
		return machine.Run<T>(STAGE, res);
	}